

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_block.h
# Opt level: O3

void __thiscall vector_block<int,_1024U>::push_back(vector_block<int,_1024U> *this,int *t)

{
  int iVar1;
  int *piVar2;
  
  if (this->_left_in_block == 0) {
    vector_block<int,1024u>::push_back();
  }
  iVar1 = *t;
  piVar2 = this->_insertpos;
  this->_insertpos = piVar2 + 1;
  *piVar2 = iVar1;
  this->_left_in_block = this->_left_in_block - 1;
  return;
}

Assistant:

void push_back(const T& t)
	{
		if (__builtin_expect(is_full(), false)) {
			_insertpos = static_cast<T*>(malloc(B*sizeof(T)));
			_index_block.push_back(_insertpos);
			_left_in_block = B;
		}
		*_insertpos++ = t;
		--_left_in_block;
	}